

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManRestoreClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int *pMap;
  int local_38;
  int local_34;
  int k;
  int j;
  Pdr_Set_t *pSet;
  int i;
  Vec_Int_t *vMap_local;
  Vec_Vec_t *vClauses_local;
  Pdr_Man_t *p_local;
  
  if (vClauses != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vClauses);
    p->vClauses = vClauses;
    if (vMap != (Vec_Int_t *)0x0) {
      for (pSet._4_4_ = 0; iVar1 = Vec_VecSize(vClauses), pSet._4_4_ < iVar1;
          pSet._4_4_ = pSet._4_4_ + 1) {
        local_34 = 0;
        while( true ) {
          pVVar2 = Vec_VecEntry(vClauses,pSet._4_4_);
          iVar1 = Vec_PtrSize(pVVar2);
          if (iVar1 <= local_34) break;
          pVVar2 = Vec_VecEntry(vClauses,pSet._4_4_);
          pvVar3 = Vec_PtrEntry(pVVar2,local_34);
          for (local_38 = 0; local_38 < *(int *)((long)pvVar3 + 0x10); local_38 = local_38 + 1) {
            pMap = Vec_IntArray(vMap);
            iVar1 = Abc_Lit2LitV(pMap,*(int *)((long)pvVar3 + (long)local_38 * 4 + 0x14));
            *(int *)((long)pvVar3 + (long)local_38 * 4 + 0x14) = iVar1;
          }
          local_34 = local_34 + 1;
        }
      }
    }
    for (pSet._4_4_ = 0; iVar1 = Vec_VecSize(p->vClauses), pSet._4_4_ < iVar1;
        pSet._4_4_ = pSet._4_4_ + 1) {
      iVar1 = Vec_VecSize(p->vClauses);
      IPdr_ManSetSolver(p,pSet._4_4_,(uint)(pSet._4_4_ < iVar1 + -1));
    }
    return 0;
  }
  __assert_fail("vClauses",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                ,0x156,"int IPdr_ManRestoreClauses(Pdr_Man_t *, Vec_Vec_t *, Vec_Int_t *)");
}

Assistant:

int IPdr_ManRestoreClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses, Vec_Int_t * vMap )
{
    int i;

    assert(vClauses);

    Vec_VecFree(p->vClauses);
    p->vClauses = vClauses;

    // remap clause literals using mapping (old flop -> new flop) found in array vMap
    if ( vMap )
    {
        Pdr_Set_t * pSet; int j, k;   
        Vec_VecForEachEntry( Pdr_Set_t *, vClauses, pSet, i, j )
            for ( k = 0; k < pSet->nLits; k++ )
                pSet->Lits[k] = Abc_Lit2LitV( Vec_IntArray(vMap), pSet->Lits[k] );
    }

    for ( i = 0; i < Vec_VecSize(p->vClauses); ++i )
        IPdr_ManSetSolver( p, i, i < Vec_VecSize( p->vClauses ) - 1 );

    return 0;
}